

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O3

void __thiscall CUI::ClipEnable(CUI *this,CUIRect *pRect)

{
  CUIRect *pCVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  ulong uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  uint uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  uint uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  
  if (this->m_NumClips == 0) {
    fVar10 = pRect->y;
    fVar11 = pRect->w;
    fVar12 = pRect->h;
    this->m_aClips[0].x = pRect->x;
    this->m_aClips[0].y = fVar10;
    this->m_aClips[0].w = fVar11;
    this->m_aClips[0].h = fVar12;
    uVar13 = 1;
  }
  else {
    dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/game/client/ui.cpp"
                   ,0xb0,(uint)(this->m_NumClips < 0x10),"max clip nesting depth exceeded");
    dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/game/client/ui.cpp"
                   ,0xca,(uint)(this->m_NumClips != 0),"no clip region");
    uVar9 = this->m_NumClips;
    uVar13 = uVar9 + 1;
    uVar5._0_4_ = pRect->x;
    uVar5._4_4_ = pRect->y;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = uVar5;
    uVar2 = pRect->w;
    uVar6 = pRect->h;
    auVar16._0_4_ = (float)uVar2 + (float)(undefined4)uVar5;
    auVar16._4_4_ = (float)uVar6 + (float)uVar5._4_4_;
    auVar16._8_8_ = 0;
    uVar3 = this->m_aClips[uVar9 - 1].x;
    uVar7 = this->m_aClips[uVar9 - 1].y;
    auVar15._4_4_ = uVar7;
    auVar15._0_4_ = uVar3;
    uVar4 = this->m_aClips[uVar9 - 1].w;
    uVar8 = this->m_aClips[uVar9 - 1].h;
    auVar17._4_4_ = (float)uVar8 + (float)uVar7;
    auVar17._0_4_ = (float)uVar4 + (float)uVar3;
    auVar17._8_8_ = 0;
    auVar17 = minps(auVar16,auVar17);
    auVar15._8_8_ = 0;
    auVar15 = maxps(auVar14,auVar15);
    pCVar1 = this->m_aClips + uVar9;
    pCVar1->x = (float)(int)auVar15._0_8_;
    pCVar1->y = (float)(int)((ulong)auVar15._0_8_ >> 0x20);
    pCVar1->w = auVar17._0_4_ - (float)(undefined4)uVar5;
    pCVar1->h = auVar17._4_4_ - (float)uVar5._4_4_;
  }
  this->m_NumClips = uVar13;
  UpdateClipping(this);
  return;
}

Assistant:

void CUI::ClipEnable(const CUIRect *pRect)
{
	if(IsClipped())
	{
		dbg_assert(m_NumClips < MAX_CLIP_NESTING_DEPTH, "max clip nesting depth exceeded");
		const CUIRect *pOldRect = ClipArea();
		CUIRect Intersection;
		Intersection.x = maximum(pRect->x, pOldRect->x);
		Intersection.y = maximum(pRect->y, pOldRect->y);
		Intersection.w = minimum(pRect->x+pRect->w, pOldRect->x+pOldRect->w) - pRect->x;
		Intersection.h = minimum(pRect->y+pRect->h, pOldRect->y+pOldRect->h) - pRect->y;
		m_aClips[m_NumClips] = Intersection;
	}
	else
	{
		m_aClips[m_NumClips] = *pRect;
	}
	m_NumClips++;
	UpdateClipping();
}